

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_array.c
# Opt level: O0

void assert_not_array(char *json)

{
  cJSON_bool cVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  char *json_local;
  parse_buffer buffer;
  
  buffer.hooks.reallocate = *(_func_void_ptr_void_ptr_size_t **)(in_FS_OFFSET + 0x28);
  memset(&json_local,0,0x38);
  json_local = json;
  sVar2 = strlen(json);
  buffer.content = (uchar *)(sVar2 + 1);
  buffer.depth = (size_t)global_hooks.allocate;
  buffer.hooks.allocate = (_func_void_ptr_size_t *)global_hooks.deallocate;
  buffer.hooks.deallocate = (_func_void_void_ptr *)global_hooks.reallocate;
  cVar1 = parse_array(item,(parse_buffer *)&json_local);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x34);
  }
  UnityAssertBits(0xff,0,(long)item[0].type,"Item doesn\'t have expected type.",0x35);
  if (item[0].next != (cJSON *)0x0) {
    UnityFail("Linked list next pointer is not NULL.",0x35);
  }
  if (item[0].prev != (cJSON *)0x0) {
    UnityFail("Linked list previous pointer is not NULL.",0x35);
  }
  if (item[0].child != (cJSON *)0x0) {
    UnityFail("Item has a child.",0x35);
  }
  if (item[0].string != (char *)0x0) {
    UnityFail("String is not NULL.",0x35);
  }
  if (item[0].valuestring != (char *)0x0) {
    UnityFail("Valuestring is not NULL.",0x35);
  }
  if (*(_func_void_ptr_void_ptr_size_t **)(in_FS_OFFSET + 0x28) != buffer.hooks.reallocate) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void assert_not_array(const char *json)
{
    parse_buffer buffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    buffer.content = (const unsigned char*)json;
    buffer.length = strlen(json) + sizeof("");
    buffer.hooks = global_hooks;

    TEST_ASSERT_FALSE(parse_array(item, &buffer));
    assert_is_invalid(item);
}